

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O3

int gzwrite(gzFile file,voidpc buf,uint len)

{
  int iVar1;
  size_t sVar2;
  uLong uVar3;
  ulong uVar4;
  ulong uVar5;
  gz_stream *s;
  
  iVar1 = -2;
  if ((file != (gzFile)0x0) && (*(char *)((long)file + 0xac) == 'w')) {
    *(voidpc *)file = buf;
    *(uint *)((long)file + 8) = len;
    if (len != 0) {
      uVar4 = (ulong)*(uint *)((long)file + 0x20);
      uVar5 = (ulong)len;
      do {
        if ((int)uVar4 == 0) {
          *(void **)((long)file + 0x18) = *(void **)((long)file + 0x88);
          sVar2 = fwrite(*(void **)((long)file + 0x88),1,0x4000,*(FILE **)((long)file + 0x78));
          if (sVar2 != 0x4000) {
            *(undefined4 *)((long)file + 0x70) = 0xffffffff;
            break;
          }
          *(undefined4 *)((long)file + 0x20) = 0x4000;
          uVar5 = (ulong)*(uint *)((long)file + 8);
          uVar4 = 0x4000;
        }
        *(long *)((long)file + 0xb8) = *(long *)((long)file + 0xb8) + uVar5;
        *(long *)((long)file + 0xc0) = *(long *)((long)file + 0xc0) + uVar4;
        iVar1 = deflate((z_streamp)file,0);
        *(int *)((long)file + 0x70) = iVar1;
        uVar5 = (ulong)*(uint *)((long)file + 8);
        uVar4 = (ulong)*(uint *)((long)file + 0x20);
        *(long *)((long)file + 0xb8) = *(long *)((long)file + 0xb8) - uVar5;
        *(long *)((long)file + 0xc0) = *(long *)((long)file + 0xc0) - uVar4;
        if ((iVar1 != 0) || (*(uint *)((long)file + 8) == 0)) break;
      } while( true );
    }
    uVar3 = crc32(*(unsigned_long *)((long)file + 0x90),(uchar *)buf,len);
    *(uLong *)((long)file + 0x90) = uVar3;
    iVar1 = len - *(int *)((long)file + 8);
  }
  return iVar1;
}

Assistant:

int ZEXPORT gzwrite (file, buf, len)
    gzFile file;
    voidpc buf;
    unsigned len;
{
    gz_stream *s = (gz_stream*)file;

    if (s == NULL || s->mode != 'w') return Z_STREAM_ERROR;

    s->stream.next_in = (Bytef*)buf;
    s->stream.avail_in = len;

    while (s->stream.avail_in != 0) {

        if (s->stream.avail_out == 0) {

            s->stream.next_out = s->outbuf;
            if (fwrite(s->outbuf, 1, Z_BUFSIZE, s->file) != Z_BUFSIZE) {
                s->z_err = Z_ERRNO;
                break;
            }
            s->stream.avail_out = Z_BUFSIZE;
        }
        s->in += s->stream.avail_in;
        s->out += s->stream.avail_out;
        s->z_err = deflate(&(s->stream), Z_NO_FLUSH);
        s->in -= s->stream.avail_in;
        s->out -= s->stream.avail_out;
        if (s->z_err != Z_OK) break;
    }
    s->crc = crc32(s->crc, (const Bytef *)buf, len);

    return (int)(len - s->stream.avail_in);
}